

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

size_t trailers_read(char *buffer,size_t size,size_t nitems,void *raw)

{
  size_t sVar1;
  char *pcVar2;
  size_t local_50;
  size_t to_copy;
  size_t bytes_left;
  dynbuf *trailers_buf;
  Curl_easy *data;
  void *raw_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  sVar1 = Curl_dyn_len((dynbuf *)((long)raw + 0x1210));
  local_50 = sVar1 - *(long *)((long)raw + 0x1208);
  if (size * nitems < local_50) {
    local_50 = size * nitems;
  }
  if (local_50 != 0) {
    pcVar2 = Curl_dyn_ptr((dynbuf *)((long)raw + 0x1210));
    memcpy(buffer,pcVar2 + *(long *)((long)raw + 0x1208),local_50);
    *(size_t *)((long)raw + 0x1208) = local_50 + *(long *)((long)raw + 0x1208);
  }
  return local_50;
}

Assistant:

static size_t trailers_read(char *buffer, size_t size, size_t nitems,
                            void *raw)
{
  struct Curl_easy *data = (struct Curl_easy *)raw;
  struct dynbuf *trailers_buf = &data->state.trailers_buf;
  size_t bytes_left = Curl_dyn_len(trailers_buf) -
    data->state.trailers_bytes_sent;
  size_t to_copy = (size*nitems < bytes_left) ? size*nitems : bytes_left;
  if(to_copy) {
    memcpy(buffer,
           Curl_dyn_ptr(trailers_buf) + data->state.trailers_bytes_sent,
           to_copy);
    data->state.trailers_bytes_sent += to_copy;
  }
  return to_copy;
}